

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# serialize_parsed_expression.cpp
# Opt level: O2

unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true> __thiscall
duckdb::ParsedExpression::Deserialize(ParsedExpression *this,Deserializer *deserializer)

{
  undefined8 uVar1;
  ExpressionClass EVar2;
  ExpressionType type;
  optional_idx oVar3;
  pointer pPVar4;
  SerializationException *this_00;
  _func_int **pp_Var5;
  undefined1 local_78 [40];
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> alias;
  
  EVar2 = Deserializer::ReadProperty<duckdb::ExpressionClass>(deserializer,100,"class");
  type = Deserializer::ReadProperty<duckdb::ExpressionType>(deserializer,0x65,"type");
  Deserializer::ReadPropertyWithDefault<std::__cxx11::string>(&alias,deserializer,0x66,"alias");
  oVar3 = Deserializer::ReadPropertyWithExplicitDefault<duckdb::optional_idx>
                    (deserializer,0x67,"query_location",(optional_idx)0xffffffffffffffff);
  SerializationData::Set<duckdb::ExpressionType>(&deserializer->data,type);
  (this->super_BaseExpression)._vptr_BaseExpression = (_func_int **)0x0;
  switch(EVar2) {
  case CASE:
    CaseExpression::Deserialize((CaseExpression *)local_78,deserializer);
    break;
  case CAST:
    CastExpression::Deserialize((CastExpression *)local_78,deserializer);
    break;
  case COLUMN_REF:
    ColumnRefExpression::Deserialize((ColumnRefExpression *)local_78,deserializer);
    break;
  case COMPARISON:
    ComparisonExpression::Deserialize((ComparisonExpression *)local_78,deserializer);
    break;
  case CONJUNCTION:
    ConjunctionExpression::Deserialize((ConjunctionExpression *)local_78,deserializer);
    break;
  case CONSTANT:
    ConstantExpression::Deserialize((ConstantExpression *)local_78,deserializer);
    break;
  case DEFAULT:
    DefaultExpression::Deserialize((Deserializer *)local_78);
    break;
  case FUNCTION:
    FunctionExpression::Deserialize((FunctionExpression *)local_78,deserializer);
    break;
  case OPERATOR:
    OperatorExpression::Deserialize((OperatorExpression *)local_78,deserializer);
    break;
  case STAR:
    StarExpression::Deserialize((StarExpression *)local_78,deserializer);
    uVar1 = local_78._0_8_;
    local_78._0_8_ = (_func_int **)0x0;
    pp_Var5 = (this->super_BaseExpression)._vptr_BaseExpression;
    (this->super_BaseExpression)._vptr_BaseExpression = (_func_int **)uVar1;
    if (pp_Var5 == (_func_int **)0x0) goto LAB_004e8cda;
    (**(code **)(*pp_Var5 + 8))();
    pp_Var5 = (_func_int **)local_78._0_8_;
    goto LAB_004e8ccf;
  default:
    this_00 = (SerializationException *)__cxa_allocate_exception(0x10);
    ::std::__cxx11::string::string
              ((string *)local_78,"Unsupported type for deserialization of ParsedExpression!",
               (allocator *)(local_78 + 0x27));
    SerializationException::SerializationException(this_00,(string *)local_78);
    __cxa_throw(this_00,&SerializationException::typeinfo,::std::runtime_error::~runtime_error);
  case SUBQUERY:
    SubqueryExpression::Deserialize((SubqueryExpression *)local_78,deserializer);
    break;
  case WINDOW:
    WindowExpression::Deserialize((WindowExpression *)local_78,deserializer);
    break;
  case PARAMETER:
    ParameterExpression::Deserialize((ParameterExpression *)local_78,deserializer);
    break;
  case COLLATE:
    CollateExpression::Deserialize((CollateExpression *)local_78,deserializer);
    break;
  case LAMBDA:
    LambdaExpression::Deserialize((LambdaExpression *)local_78,deserializer);
    break;
  case POSITIONAL_REFERENCE:
    PositionalReferenceExpression::Deserialize
              ((PositionalReferenceExpression *)local_78,deserializer);
    break;
  case BETWEEN:
    BetweenExpression::Deserialize((BetweenExpression *)local_78,deserializer);
    break;
  case LAMBDA_REF:
    LambdaRefExpression::Deserialize((LambdaRefExpression *)local_78,deserializer);
  }
  pp_Var5 = (this->super_BaseExpression)._vptr_BaseExpression;
  (this->super_BaseExpression)._vptr_BaseExpression = (_func_int **)local_78._0_8_;
LAB_004e8ccf:
  if (pp_Var5 != (_func_int **)0x0) {
    (**(code **)(*pp_Var5 + 8))();
  }
LAB_004e8cda:
  SerializationData::Unset<duckdb::ExpressionType>(&deserializer->data);
  pPVar4 = unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true>
           ::operator->((unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true>
                         *)this);
  ::std::__cxx11::string::operator=
            ((string *)&(pPVar4->super_BaseExpression).alias,(string *)&alias);
  pPVar4 = unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true>
           ::operator->((unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true>
                         *)this);
  (pPVar4->super_BaseExpression).query_location.index = oVar3.index;
  ::std::__cxx11::string::~string((string *)&alias);
  return (unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>_>)
         (unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>_>)this;
}

Assistant:

unique_ptr<ParsedExpression> ParsedExpression::Deserialize(Deserializer &deserializer) {
	auto expression_class = deserializer.ReadProperty<ExpressionClass>(100, "class");
	auto type = deserializer.ReadProperty<ExpressionType>(101, "type");
	auto alias = deserializer.ReadPropertyWithDefault<string>(102, "alias");
	auto query_location = deserializer.ReadPropertyWithExplicitDefault<optional_idx>(103, "query_location", optional_idx());
	deserializer.Set<ExpressionType>(type);
	unique_ptr<ParsedExpression> result;
	switch (expression_class) {
	case ExpressionClass::BETWEEN:
		result = BetweenExpression::Deserialize(deserializer);
		break;
	case ExpressionClass::CASE:
		result = CaseExpression::Deserialize(deserializer);
		break;
	case ExpressionClass::CAST:
		result = CastExpression::Deserialize(deserializer);
		break;
	case ExpressionClass::COLLATE:
		result = CollateExpression::Deserialize(deserializer);
		break;
	case ExpressionClass::COLUMN_REF:
		result = ColumnRefExpression::Deserialize(deserializer);
		break;
	case ExpressionClass::COMPARISON:
		result = ComparisonExpression::Deserialize(deserializer);
		break;
	case ExpressionClass::CONJUNCTION:
		result = ConjunctionExpression::Deserialize(deserializer);
		break;
	case ExpressionClass::CONSTANT:
		result = ConstantExpression::Deserialize(deserializer);
		break;
	case ExpressionClass::DEFAULT:
		result = DefaultExpression::Deserialize(deserializer);
		break;
	case ExpressionClass::FUNCTION:
		result = FunctionExpression::Deserialize(deserializer);
		break;
	case ExpressionClass::LAMBDA:
		result = LambdaExpression::Deserialize(deserializer);
		break;
	case ExpressionClass::LAMBDA_REF:
		result = LambdaRefExpression::Deserialize(deserializer);
		break;
	case ExpressionClass::OPERATOR:
		result = OperatorExpression::Deserialize(deserializer);
		break;
	case ExpressionClass::PARAMETER:
		result = ParameterExpression::Deserialize(deserializer);
		break;
	case ExpressionClass::POSITIONAL_REFERENCE:
		result = PositionalReferenceExpression::Deserialize(deserializer);
		break;
	case ExpressionClass::STAR:
		result = StarExpression::Deserialize(deserializer);
		break;
	case ExpressionClass::SUBQUERY:
		result = SubqueryExpression::Deserialize(deserializer);
		break;
	case ExpressionClass::WINDOW:
		result = WindowExpression::Deserialize(deserializer);
		break;
	default:
		throw SerializationException("Unsupported type for deserialization of ParsedExpression!");
	}
	deserializer.Unset<ExpressionType>();
	result->alias = std::move(alias);
	result->query_location = query_location;
	return result;
}